

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O3

void deqp::gles3::Functional::evalTexture2DArrayShadowGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  float r;
  Texture2DArray *pTVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = c->in[0].m_data[3];
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  pTVar1 = c->textures[0].tex2DArray;
  fVar3 = (float)pTVar1->m_width;
  r = c->in[0].m_data[2];
  fVar4 = (float)pTVar1->m_height;
  fVar3 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar3,c->in[1].m_data[1] * fVar4,
                     fVar3 * c->in[2].m_data[0],fVar4 * c->in[2].m_data[1]);
  fVar2 = tcu::Texture2DArrayView::sampleCompare
                    (&(c->textures[0].tex2DArray)->m_view,&c->textures[0].sampler,fVar2,s,t,r,fVar3)
  ;
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

static void		evalTexture2DArrayShadowGrad	(gls::ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DArrayShadow(c, c.in[0].w(), c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad2DArray(c)); }